

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  REF_DBL *xyz_00;
  uint uVar4;
  REF_INT *pRVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  REF_DBL *distance_00;
  REF_INT part_complete;
  REF_INT ncell;
  REF_DBL *xyz;
  REF_SEARCH ref_search;
  REF_INT local_node_per;
  REF_INT local_ncell;
  REF_DBL *local_xyz;
  REF_DBL radius;
  REF_DBL center [3];
  uint n;
  REF_DBL *local_a8;
  REF_INT *local_a0;
  REF_NODE local_98;
  ulong local_90;
  REF_SEARCH local_88;
  int local_7c;
  uint local_78;
  REF_INT local_74;
  REF_DBL *local_70;
  REF_DBL *local_68;
  REF_INT *local_60;
  REF_DBL *local_58;
  double local_50;
  REF_DBL local_48 [3];
  
  ref_mpi = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  uVar10 = (ref_grid->twod == 0) + 2;
  uVar6 = (ulong)uVar10;
  iVar1 = pRVar2->max;
  if (0 < (long)iVar1) {
    pRVar3 = pRVar2->global;
    lVar7 = 0;
    do {
      if (-1 < pRVar3[lVar7]) {
        distance[lVar7] = 1e+200;
      }
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  uVar4 = ref_phys_local_wall(ref_grid,ref_dict,(REF_INT *)&local_78,&local_74,&local_70);
  if (uVar4 == 0) {
    if (uVar10 == local_78) {
      if ((long)ref_mpi->n < 0) {
        pcVar9 = "malloc part_ncell of REF_INT negative";
        uVar8 = 0x687;
LAB_001fb44b:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               uVar8,"ref_phys_wall_distance_static",pcVar9);
        uVar4 = 1;
      }
      else {
        pRVar5 = (REF_INT *)malloc((long)ref_mpi->n << 2);
        if (pRVar5 == (REF_INT *)0x0) {
          pcVar9 = "malloc part_ncell of REF_INT NULL";
          uVar8 = 0x687;
LAB_001fb47b:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 uVar8,"ref_phys_wall_distance_static",pcVar9);
          uVar4 = 2;
        }
        else {
          local_98 = pRVar2;
          uVar4 = ref_mpi_allgather(ref_mpi,&local_74,pRVar5,1);
          if (uVar4 == 0) {
            uVar4 = 0;
            if (0 < ref_mpi->n) {
              local_7c = uVar10 * 3;
              local_68 = local_70;
              local_90 = uVar6;
              local_60 = pRVar5;
              do {
                local_a8 = (REF_DBL *)0x0;
                n = 0;
                uVar10 = ref_phys_bcast_parts
                                   (ref_mpi,(REF_INT *)&stack0xffffffffffffff40,local_60,
                                    (REF_INT)uVar6,(REF_INT)local_68,
                                    (REF_DBL *)&stack0xffffffffffffff44,(REF_INT *)&local_a8,
                                    (REF_DBL **)(ulong)uVar4);
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x699,"ref_phys_wall_distance_static",(ulong)uVar10,"bcast part");
                  return uVar10;
                }
                uVar6 = (ulong)n;
                uVar10 = ref_search_create(&local_88,n);
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x69d,"ref_phys_wall_distance_static",(ulong)uVar10,"make search");
                  return uVar10;
                }
                if ((int)n < 0) {
                  pcVar9 = "malloc permutation of REF_INT negative";
                  uVar8 = 0x69e;
                  goto LAB_001fb44b;
                }
                pRVar5 = (REF_INT *)malloc(uVar6 * 4);
                if (pRVar5 == (REF_INT *)0x0) {
                  pcVar9 = "malloc permutation of REF_INT NULL";
                  uVar8 = 0x69e;
                  goto LAB_001fb47b;
                }
                local_a0 = pRVar5;
                uVar10 = ref_sort_shuffle(n,pRVar5);
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x69f,"ref_phys_wall_distance_static",(ulong)uVar10,"shuffle");
                  return uVar10;
                }
                if (uVar6 != 0) {
                  local_58 = local_a8;
                  if ((int)n < 2) {
                    uVar6 = 1;
                  }
                  uVar12 = 0;
                  do {
                    iVar1 = local_a0[uVar12];
                    uVar10 = ref_node_bounding_sphere_xyz
                                       (local_58 + local_7c * iVar1,(REF_INT)local_90,local_48,
                                        &local_50);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,0x6a4,"ref_phys_wall_distance_static",(ulong)uVar10,"bound");
                      return uVar10;
                    }
                    uVar10 = ref_search_insert(local_88,iVar1,local_48,local_50 * 1.00000001);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,0x6a5,"ref_phys_wall_distance_static",(ulong)uVar10,"ins");
                      return uVar10;
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar6 != uVar12);
                }
                free(local_a0);
                xyz_00 = local_a8;
                if (0 < local_98->max) {
                  lVar11 = 0;
                  lVar7 = 0;
                  distance_00 = distance;
                  do {
                    if ((-1 < local_98->global[lVar7]) &&
                       (uVar10 = ref_search_nearest_element
                                           (local_88,(REF_INT)local_90,xyz_00,
                                            (REF_DBL *)((long)ref_grid->node->real + lVar11),
                                            distance_00), uVar10 != 0)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,0x6b5,"ref_phys_wall_distance_static",(ulong)uVar10,"candidates");
                      return uVar10;
                    }
                    lVar7 = lVar7 + 1;
                    lVar11 = lVar11 + 0x78;
                    distance_00 = distance_00 + 1;
                  } while (lVar7 < local_98->max);
                }
                uVar10 = ref_search_free(local_88);
                uVar6 = local_90;
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x6b7,"ref_phys_wall_distance_static",(ulong)uVar10,"free");
                  return uVar10;
                }
                if (local_a8 != (REF_DBL *)0x0) {
                  free(local_a8);
                }
                pRVar5 = local_60;
              } while ((int)uVar4 < ref_mpi->n);
            }
            free(pRVar5);
            uVar4 = 0;
            if (local_70 != (REF_DBL *)0x0) {
              free(local_70);
              uVar4 = 0;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x689,"ref_phys_wall_distance_static",(ulong)uVar4,"allgather part ncell");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x685,
             "ref_phys_wall_distance_static","node_per miss match",(ulong)uVar10,(long)(int)local_78
            );
      uVar4 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x684,
           "ref_phys_wall_distance_static",(ulong)uVar4,"local wall");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,
                                                 REF_DICT ref_dict,
                                                 REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_BOOL timing = REF_FALSE;

  if (timing) ref_mpi_stopwatch_start(ref_mpi);

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");
  if (timing && ref_mpi_once(ref_mpi)) {
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) {
      printf("%d part %d ncell\n", i, part_ncell[i]);
    }
  }
  if (timing) ref_mpi_stopwatch_stop(ref_mpi, "wall dist init");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "form-scatter");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "create-insert");
    if (timing && ref_mpi_once(ref_mpi)) {
      REF_INT depth;
      RSS(ref_search_depth(ref_search, &depth), "depth");
      printf("ncell %d depth %d\n", ncell, depth);
    }
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "depth");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "min(dist)");
  }

  ref_free(part_ncell);
  ref_free(local_xyz);
  return REF_SUCCESS;
}